

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

bool __thiscall
SGParser::Generator::RegExprDFAParseHandler::Reduce
          (RegExprDFAParseHandler *this,Parse<SGParser::Generator::RegExprDFAParseElement> *parse,
          uint productionID)

{
  pointer *pppRVar1;
  _Rb_tree_header *p_Var2;
  RegExprDataType RVar3;
  pointer puVar4;
  Parse<SGParser::Generator::RegExprDFAParseElement> *pPVar5;
  anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 aVar6;
  RegExprDFAParseHandler *pRVar7;
  uint uVar8;
  pointer puVar9;
  RegExprDFANode *pRVar10;
  const_iterator cVar11;
  iterator iVar12;
  anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 *paVar13;
  RegExprDFAParseElement *pRVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar15;
  long *plVar16;
  _Base_ptr p_Var17;
  long *plVar18;
  long lVar19;
  uint *ord;
  bool bVar20;
  iterator iVar21;
  IndexType IVar22;
  iterator iVar23;
  ulong uVar24;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar25;
  uint uVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  RegExprDFAParseHandler *local_88;
  Parse<SGParser::Generator::RegExprDFAParseElement> *local_80;
  anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 local_78;
  string names;
  vector<unsigned_int,_std::allocator<unsigned_int>_> charList;
  
  switch(productionID) {
  case 1:
    pRVar10 = (RegExprDFANode *)operator_new(0x80);
    pRVar10->Type = And;
    pRVar10->ID = 0;
    pRVar10->Position = 0;
    (pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish + 5) = 0;
    *(undefined8 *)
     ((long)&(pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar10->pParent = (RegExprDFANode *)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    RegExprDFANode::Add(pRVar10,(pRVar14->field_1).pNode);
    IVar22 = 1;
    goto LAB_0014489e;
  case 2:
  case 4:
  case 8:
    break;
  case 3:
    pRVar10 = (RegExprDFANode *)operator_new(0x80);
    pRVar10->Type = Or;
    pRVar10->ID = 0;
    pRVar10->Position = 0;
    (pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish + 5) = 0;
    *(undefined8 *)
     ((long)&(pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar10->pParent = (RegExprDFANode *)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    RegExprDFANode::Add(pRVar10,(pRVar14->field_1).pNode);
    IVar22 = 2;
    goto LAB_0014489e;
  case 5:
    pRVar10 = (RegExprDFANode *)operator_new(0x80);
    pRVar10->Type = Star;
    pRVar10->ID = 0;
    goto LAB_001446ea;
  case 6:
    pRVar10 = (RegExprDFANode *)operator_new(0x80);
    pRVar10->Type = Plus;
    pRVar10->ID = 0;
    goto LAB_001446ea;
  case 7:
    pRVar10 = (RegExprDFANode *)operator_new(0x80);
    pRVar10->Type = Question;
    pRVar10->ID = 0;
LAB_001446ea:
    pRVar10->Position = 0;
    (pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish + 5) = 0;
    *(undefined8 *)
     ((long)&(pRVar10->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar10->pParent = (RegExprDFANode *)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    IVar22 = 0;
LAB_0014489e:
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,IVar22);
    RegExprDFANode::Add(pRVar10,(pRVar14->field_1).pNode);
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar14->field_1).pNode = pRVar10;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar14->DataType = Node;
    break;
  case 9:
    goto switchD_00144159_caseD_9;
  case 10:
    pRVar10 = (RegExprDFANode *)operator_new(0x80);
    uVar8 = this->PositionCount;
    this->PositionCount = uVar8 + 1;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    RegExprDFANode::RegExprDFANode(pRVar10,Char,uVar8,(pRVar14->field_1).ch);
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar14->field_1).pNode = pRVar10;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar14->DataType = Node;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    iVar21._M_current =
         (this->Nodes).
         super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar21._M_current ==
        (this->Nodes).
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
      ::_M_realloc_insert<SGParser::Generator::RegExprDFANode*const&>
                ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                  *)&this->Nodes,iVar21,&(pRVar14->field_1).pNode);
    }
    else {
      *iVar21._M_current = (RegExprDFANode *)*(RegExprDFANode **)&pRVar14->field_1;
      pppRVar1 = &(this->Nodes).
                  super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppRVar1 = *pppRVar1 + 1;
    }
    break;
  case 0xb:
    names.field_2._8_8_ = 0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&names.field_2 + 8),
               0xfd);
    local_78.ch = 1;
    uVar8 = 1;
    do {
      if (((char)uVar8 != '\n') && ((uVar8 & 0xff) != 0xd)) {
        if (charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     (names.field_2._M_local_buf + 8),
                     (iterator)
                     charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_78.ch);
        }
        else {
          *charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = uVar8;
          charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      uVar8 = local_78.ch + 1;
      local_78.ch = uVar8;
    } while (uVar8 < 0x100);
    pRVar10 = (RegExprDFANode *)operator_new(0x80);
    uVar8 = this->PositionCount;
    this->PositionCount = uVar8 + 1;
    pRVar10->Type = Char;
    pRVar10->ID = 0;
    pRVar10->Position = uVar8;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pRVar10->Chars,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&names.field_2 + 8));
    pRVar10->AcceptingState = 0;
    pRVar10->Nullable = false;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar10->pParent = (RegExprDFANode *)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar14->field_1).pNode = pRVar10;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar14->DataType = Node;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    paVar13 = &pRVar14->field_1;
    iVar21._M_current =
         (this->Nodes).
         super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar21._M_current ==
        (this->Nodes).
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
      ::_M_realloc_insert<SGParser::Generator::RegExprDFANode*const&>
                ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                  *)&this->Nodes,iVar21,&paVar13->pNode);
    }
    else {
LAB_0014481d:
      *iVar21._M_current = (RegExprDFANode *)*(RegExprDFANode **)paVar13;
      pppRVar1 = &(this->Nodes).
                  super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppRVar1 = *pppRVar1 + 1;
    }
    goto LAB_00144828;
  case 0xc:
    local_88 = this;
    local_80 = parse;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    pvVar15 = (pRVar14->field_1).pChars;
    names.field_2._8_8_ = 0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar9 = (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar9) {
      uVar24 = 0;
      do {
        uVar8 = puVar9[uVar24];
        local_78.ch = uVar8;
        if (uVar8 <= (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar24 + 1]) {
          do {
            if (charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         (names.field_2._M_local_buf + 8),
                         (iterator)
                         charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,&local_78.ch);
            }
            else {
              *charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = uVar8;
              charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            uVar8 = local_78.ch + 1;
            local_78.ch = uVar8;
          } while (uVar8 <= (pvVar15->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[uVar24 | 1]);
        }
        uVar24 = uVar24 + 2;
        puVar9 = (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar24 < (ulong)((long)(pvVar15->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >>
                               2));
    }
    pPVar5 = local_80;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](local_80,1);
    RegExprDFAParseElement::Destroy(pRVar14);
    pRVar10 = (RegExprDFANode *)operator_new(0x80);
    this = local_88;
    uVar8 = local_88->PositionCount;
    local_88->PositionCount = uVar8 + 1;
    pRVar10->Type = Char;
    pRVar10->ID = 0;
    pRVar10->Position = uVar8;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pRVar10->Chars,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&names.field_2 + 8));
    pRVar10->AcceptingState = 0;
    pRVar10->Nullable = false;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar10->pParent = (RegExprDFANode *)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](pPVar5,0);
    (pRVar14->field_1).pNode = pRVar10;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](pPVar5,0);
    pRVar14->DataType = Node;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](pPVar5,0);
    paVar13 = &pRVar14->field_1;
    iVar21._M_current =
         (this->Nodes).
         super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar21._M_current !=
        (this->Nodes).
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0014481d;
    std::
    vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
    ::_M_realloc_insert<SGParser::Generator::RegExprDFANode*const&>
              ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                *)&this->Nodes,iVar21,&paVar13->pNode);
    goto LAB_00144828;
  case 0xd:
    local_80 = parse;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
    pvVar15 = (pRVar14->field_1).pChars;
    names.field_2._8_8_ = 0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.ch = 1;
    uVar8 = 1;
    do {
      puVar9 = (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar19 = (long)(pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar9;
      if (lVar19 == 0) {
LAB_0014439d:
        if (charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     (names.field_2._M_local_buf + 8),
                     (iterator)
                     charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_78.ch);
        }
        else {
          *charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = uVar8;
          charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      else {
        bVar20 = false;
        uVar24 = 0;
        do {
          for (uVar26 = puVar9[uVar24]; uVar26 <= puVar9[uVar24 + 1]; uVar26 = uVar26 + 1) {
            if (uVar8 == uVar26) {
              bVar20 = true;
            }
          }
          uVar24 = uVar24 + 2;
        } while (uVar24 < (ulong)(lVar19 >> 2));
        if (!bVar20) goto LAB_0014439d;
      }
      pPVar5 = local_80;
      uVar8 = local_78.ch + 1;
      local_78.ch = uVar8;
    } while (uVar8 < 0x100);
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](local_80,2);
    RegExprDFAParseElement::Destroy(pRVar14);
    pRVar10 = (RegExprDFANode *)operator_new(0x80);
    uVar8 = this->PositionCount;
    this->PositionCount = uVar8 + 1;
    pRVar10->Type = Char;
    pRVar10->ID = 0;
    pRVar10->Position = uVar8;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pRVar10->Chars,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&names.field_2 + 8));
    pRVar10->AcceptingState = 0;
    pRVar10->Nullable = false;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar10->pParent = (RegExprDFANode *)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar10->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](pPVar5,0);
    (pRVar14->field_1).pNode = pRVar10;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](pPVar5,0);
    pRVar14->DataType = Node;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](pPVar5,0);
    paVar13 = &pRVar14->field_1;
    iVar21._M_current =
         (this->Nodes).
         super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar21._M_current !=
        (this->Nodes).
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0014481d;
    std::
    vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
    ::_M_realloc_insert<SGParser::Generator::RegExprDFANode*const&>
              ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                *)&this->Nodes,iVar21,&paVar13->pNode);
LAB_00144828:
    if (names.field_2._8_8_ != 0) {
      operator_delete((void *)names.field_2._8_8_,
                      (long)charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish - names.field_2._8_8_);
    }
    break;
  case 0xe:
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    if ((pRVar14->field_1).pChars == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("parse[1].pChars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0x2f1,
                    "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                   );
    }
    names.field_2._8_8_ =
         &charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    local_88 = this;
    Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    std::__cxx11::string::reserve((ulong)((long)&names.field_2 + 8));
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    puVar9 = (((pRVar14->field_1).pChars)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (((pRVar14->field_1).pChars)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar9 != puVar4) {
      do {
        std::__cxx11::string::push_back((char)&names + '\x18');
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar4);
    }
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    RegExprDFAParseElement::Destroy(pRVar14);
    pRVar7 = local_88;
    pPVar5 = (Parse<SGParser::Generator::RegExprDFAParseElement> *)local_88->pMacroSyntaxTrees;
    if (pPVar5 == (Parse<SGParser::Generator::RegExprDFAParseElement> *)0x0) {
      __assert_fail("pMacroSyntaxTrees != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0x2fc,
                    "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                   );
    }
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                     *)pPVar5,(key_type *)((long)&names.field_2 + 8));
    p_Var2 = (_Rb_tree_header *)&pPVar5->pTokenizer;
    if ((_Rb_tree_header *)cVar11._M_node == p_Var2) {
      local_78.pChars =
           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&names._M_string_length;
      names._M_dataplus._M_p = (pointer)0x0;
      names._M_string_length._0_1_ = 0;
      p_Var17 = (_Base_ptr)(pPVar5->Stream).pSourceStream;
      local_80 = pPVar5;
      if ((_Rb_tree_header *)p_Var17 != p_Var2) {
        do {
          std::operator+(&local_c8," \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var17 + 1));
          plVar16 = (long *)std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_c8,local_c8._M_string_length,0,'\x01');
          plVar18 = plVar16 + 2;
          if ((long *)*plVar16 == plVar18) {
            local_98 = *plVar18;
            lStack_90 = plVar16[3];
            local_a8 = &local_98;
          }
          else {
            local_98 = *plVar18;
            local_a8 = (long *)*plVar16;
          }
          local_a0 = plVar16[1];
          *plVar16 = (long)plVar18;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_78.ch,(ulong)local_a8);
          if (local_a8 != &local_98) {
            operator_delete(local_a8,local_98 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
        } while ((_Rb_tree_header *)p_Var17 != p_Var2);
      }
      Lex::CheckForErrorAndReport
                (pRVar7->pLex,"Macro \'%s\' not defined; there are %zu known macros:%s",
                 names.field_2._8_8_,(local_80->Stream).pThisBlock,local_78.pChars);
      if (local_78.pChars !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&names._M_string_length) {
        operator_delete(local_78.pChars,
                        CONCAT71(names._M_string_length._1_7_,(undefined1)names._M_string_length) +
                        1);
      }
      bVar20 = true;
    }
    else {
      if (pRVar7->pLex == (Lex *)0x0) {
        __assert_fail("pLex != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x30a,
                      "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                     );
      }
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)pRVar7->pLex,(key_type *)((long)&names.field_2 + 8));
      if ((_Rb_tree_header *)iVar12._M_node ==
          &(pRVar7->pLex->Macros)._M_t._M_impl.super__Rb_tree_header) {
        __assert_fail("pLex->Macros.find(macroName) != pLex->Macros.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x30b,
                      "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                     );
      }
      lVar19 = *(long *)(cVar11._M_node + 2);
      if (lVar19 == 0) {
        __assert_fail("iter->second",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x30e,
                      "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                     );
      }
      pvVar15 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(lVar19 + 8);
      if (pvVar15 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        bVar20 = true;
        Lex::CheckForErrorAndReport
                  (pRVar7->pLex,"Invalid regular expression in macro \'%s\' used",
                   names.field_2._8_8_);
      }
      else {
        pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
        (pRVar14->field_1).pChars = pvVar15;
        pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
        pRVar14->DataType = Node;
        std::
        vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<SGParser::Generator::RegExprDFANode**,std::vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>>>
                  ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                    *)&local_88->Nodes,
                   (local_88->Nodes).
                   super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar19 + 0x10),
                   *(undefined8 *)(lVar19 + 0x18));
        *(undefined8 *)(lVar19 + 8) = 0;
        bVar20 = false;
      }
    }
    if ((pointer *)names.field_2._8_8_ !=
        &charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete((void *)names.field_2._8_8_,
                      (long)charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 1);
    }
    if (bVar20) {
      return false;
    }
    break;
  case 0xf:
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    names.field_2._8_4_ = (pRVar14->field_1).ch;
    pvVar15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar14->field_1).pChars = pvVar15;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar14->DataType = Chars;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar14->field_1).pChars;
    iVar23._M_current = *(uint **)(pvVar25 + 8);
    if (iVar23._M_current == *(uint **)(pvVar25 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar25,iVar23,(uint *)(names.field_2._M_local_buf + 8));
    }
    else {
      *iVar23._M_current = names.field_2._8_4_;
      *(uint **)(pvVar25 + 8) = iVar23._M_current + 1;
    }
    goto LAB_00144b84;
  case 0x10:
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar14->field_1).pChars;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    iVar23._M_current = *(uint **)(pvVar25 + 8);
    if (iVar23._M_current == *(uint **)(pvVar25 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar25,iVar23,&(pRVar14->field_1).ch);
    }
    else {
      *iVar23._M_current = (pRVar14->field_1).ch;
      *(uint **)(pvVar25 + 8) = iVar23._M_current + 1;
    }
    goto switchD_00144159_caseD_9;
  case 0x11:
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    names.field_2._8_4_ = (pRVar14->field_1).ch;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
    local_78.ch = (pRVar14->field_1).ch;
    pvVar15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar14->field_1).pChars = pvVar15;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar14->DataType = Chars;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar14->field_1).pChars;
    iVar23._M_current = *(uint **)(pvVar25 + 8);
    if (iVar23._M_current == *(uint **)(pvVar25 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar25,iVar23,(uint *)(names.field_2._M_local_buf + 8));
    }
    else {
      *iVar23._M_current = names.field_2._8_4_;
      *(uint **)(pvVar25 + 8) = iVar23._M_current + 1;
    }
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar14->field_1).pChars;
    iVar23._M_current = *(uint **)(pvVar25 + 8);
    if (iVar23._M_current == *(pointer *)(pvVar25 + 0x10)) {
      paVar13 = &local_78;
      goto LAB_00144be6;
    }
    names.field_2._8_4_ = local_78.ch;
    goto LAB_00144bd3;
  case 0x12:
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    names.field_2._8_4_ = (pRVar14->field_1).ch;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
    local_78.ch = (pRVar14->field_1).ch;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
    pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar14->field_1).pChars;
    iVar23._M_current = *(uint **)(pvVar25 + 8);
    if (iVar23._M_current == *(uint **)(pvVar25 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar25,iVar23,(uint *)(names.field_2._M_local_buf + 8));
    }
    else {
      *iVar23._M_current = names.field_2._8_4_;
      *(uint **)(pvVar25 + 8) = iVar23._M_current + 1;
    }
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
    pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar14->field_1).pChars;
    iVar23._M_current = *(uint **)(pvVar25 + 8);
    if (iVar23._M_current == *(uint **)(pvVar25 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar25,iVar23,&local_78.ch);
    }
    else {
      *iVar23._M_current = local_78.ch;
      *(uint **)(pvVar25 + 8) = iVar23._M_current + 1;
    }
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
    aVar6 = pRVar14->field_1;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar14->field_1 = aVar6;
    IVar22 = 3;
    goto LAB_00144b5e;
  case 0x13:
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    names.field_2._8_4_ = (pRVar14->field_1).ch;
    pvVar15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar14->field_1).pChars = pvVar15;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar14->DataType = Chars;
LAB_00144b84:
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar14->field_1).pChars;
    iVar23._M_current = *(uint **)(pvVar25 + 8);
    if (iVar23._M_current == *(pointer *)(pvVar25 + 0x10)) {
      paVar13 = (anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 *)
                (names.field_2._M_local_buf + 8);
LAB_00144be6:
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar25,iVar23,&paVar13->ch);
    }
    else {
LAB_00144bd3:
      *iVar23._M_current = names.field_2._8_4_;
      *(uint **)(pvVar25 + 8) = iVar23._M_current + 1;
    }
    break;
  case 0x14:
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pRVar14->field_1).pChars;
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    paVar13 = &pRVar14->field_1;
    iVar23._M_current = *(uint **)(pvVar25 + 8);
    if (iVar23._M_current != *(pointer *)(pvVar25 + 0x10)) {
      *iVar23._M_current = paVar13->ch;
      *(uint **)(pvVar25 + 8) = iVar23._M_current + 1;
      return true;
    }
    goto LAB_00144be6;
  default:
    pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar14->DataType = Null;
  }
  return true;
switchD_00144159_caseD_9:
  pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
  aVar6 = pRVar14->field_1;
  pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
  pRVar14->field_1 = aVar6;
  IVar22 = 1;
LAB_00144b5e:
  pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,IVar22);
  RVar3 = pRVar14->DataType;
  pRVar14 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
  pRVar14->DataType = RVar3;
  return true;
}

Assistant:

bool Reduce(Parse<RegExprDFAParseElement>& parse, unsigned productionID) override {
        switch (productionID) {
            // RegExp --> RegExp  A
            case RE_RegExpConcat: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::And};
                pnewNode->Add(parse[0].pNode);
                pnewNode->Add(parse[1].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // RegExp --> A
            case RE_RegExp:
                break;

                // A --> A '|' B
            case RE_AOr: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Or};
                pnewNode->Add(parse[0].pNode);
                pnewNode->Add(parse[2].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }
                // A --> B
            case RE_A:
                break;

                // B --> B '*'
            case RE_BStar: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Star};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }
                // B --> B '+'
            case RE_BPlus: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Plus};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // B --> B '?'
            case RE_BQuestion: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Question};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // B --> C
            case RE_B:
                break;

                // C --> '(' RegExp ')'
            case RE_CParen:
                parse[0].pNode    = parse[1].pNode;
                parse[0].DataType = parse[1].DataType;
                break;

                // C --> character
            case RE_CChar:
                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, parse[0].ch};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;

                // C --> '.'
            case RE_CDot: {
                // Construct a list of all characters but '\n'
                std::vector<unsigned> charList;
                charList.reserve(253u);
                for (unsigned k = 1u; k <= 255u; ++k)
                    if (k != '\n' && k != '\r')
                        charList.push_back(k);

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '[' GroupSet ']'
            case RE_CGroupSet: {
                const auto pgroupSet = parse[1].pChars;
                std::vector<unsigned> charList;

                // Construct a list of all the characters represented by the groupSet...
                for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                    for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                        charList.push_back(j);

                // Delete std::vector
                parse[1].Destroy();

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '[' '^' GroupSet ']'
            case RE_CNotGroupSet: {
                // Make a NFA out of the sequence
                const auto pgroupSet = parse[2].pChars;
                std::vector<unsigned> charList;

                // Construct a list of all the characters NOT represented by the groupSet...
                // NOTE: Depends on 0..255 ASCII
                for (unsigned k = 1u; k <= 255u; ++k) {
                    bool f = false;
                    for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                        for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                            if (j == k)
                                f = true;

                    if (!f)
                        charList.push_back(k);
                }
                // Delete std::vector
                parse[2].Destroy();

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '{' CharSet '}'
            case RE_CCharSet: {
                // Generate a string from the char std::vector
                SG_ASSERT(parse[1].pChars);
                String macroName;
                macroName.reserve(parse[1].pChars->size());
                for (auto const& ord : *parse[1].pChars) {
                    macroName.push_back(char(ord));
                }

                // Delete the character std::vector
                parse[1].Destroy();

                // Try to find it in macro list
                SG_ASSERT(pMacroSyntaxTrees != nullptr);
                auto const& map = *pMacroSyntaxTrees;
                auto const& iter = map.find(macroName);
                if (iter == map.end()) {
                    std::string names;
                    for (auto const& [name, _] : map)
                        names += " '" + name + '\'';
                    pLex->CheckForErrorAndReport("Macro '%s' not defined; there are %zu known macros:%s",
                                                 macroName.data(), map.size(), names.data());
                    // Bad!
                    return false;
                }

                // Invariant: macroName should also be in pLex->Macros:
                SG_ASSERT(pLex != nullptr);
                SG_ASSERT(pLex->Macros.find(macroName) != pLex->Macros.end());

                // Get the macro node from the Macros list
                SG_ASSERT(iter->second);
                auto& macroTree = *iter->second;

                if (!macroTree.pRoot) {
                    pLex->CheckForErrorAndReport("Invalid regular expression in macro '%s' used",
                                                 macroName.data());
                    // Bad!
                    return false;
                }

                // Change all the character positions
                parse[0].pNode    = macroTree.pRoot;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                // Take care of nodes
                Nodes.insert(Nodes.end(), macroTree.CharNodes.begin(), macroTree.CharNodes.end());

                // clear the temporary tree
                macroTree.pRoot = nullptr;
                break;
            }

            // GroupSet --> character
            case RE_GroupSetChar: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;

                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                parse[0].pChars->push_back(code);
                break;
            }

                // GroupSet --> character GroupSet
            case RE_GroupSetCharGroupSet:
                // Add the char to the end of the CharSet std::vector
                parse[1].pChars->push_back(parse[0].ch);
                parse[0].pChars   = parse[1].pChars;
                parse[0].DataType = parse[1].DataType;
                break;

                // GroupSet --> character '-' character
            case RE_GroupSetCharList: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                parse[0].pChars->push_back(code2);
                break;
            }

                // GroupSet --> character '-' character GroupSet
            case RE_GroupSetCharListGroupSet: {
                // Add the char to the end of the CharSet std::vector
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[3].pChars->push_back(code);
                parse[3].pChars->push_back(code2);
                parse[0].pChars   = parse[3].pChars;
                parse[0].DataType = parse[3].DataType;
                break;
            }

                // CharSet --> character
            case RE_CharSet: {
                // Get the code and add it to the new std::vector
                const auto code   = parse[0].ch;
                // Create a new std::vector of chars
                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                break;
            }

                // CharSet --> CharSet character
            case RE_CharSetChar:
                // Add the char to the end of the CharSet std::vector
                parse[0].pChars->push_back(parse[1].ch);
                break;

            default:
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Null;
                break;
        }

        return true;
    }